

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_parse_certificate_chain(mbedtls_ssl_context *ssl,mbedtls_x509_crt *chain)

{
  uchar uVar1;
  uchar uVar2;
  size_t sVar3;
  int ret_00;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  uchar local_39;
  uint8_t alert;
  size_t n;
  size_t i;
  int ret;
  mbedtls_x509_crt *chain_local;
  mbedtls_ssl_context *ssl_local;
  
  if (ssl->in_msgtype == 0x16) {
    if (*ssl->in_msg == '\v') {
      uVar6 = ssl->in_hslen;
      sVar4 = mbedtls_ssl_hs_hdr_len(ssl);
      if (uVar6 < sVar4 + 6) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x1ba5,"bad certificate message");
        mbedtls_ssl_send_alert_message(ssl,'\x02','2');
        ssl_local._4_4_ = -0x7300;
      }
      else {
        sVar4 = mbedtls_ssl_hs_hdr_len(ssl);
        uVar1 = ssl->in_msg[sVar4 + 1];
        uVar2 = ssl->in_msg[sVar4 + 2];
        if ((ssl->in_msg[sVar4] == '\0') &&
           (sVar3 = ssl->in_hslen, sVar5 = mbedtls_ssl_hs_hdr_len(ssl),
           sVar3 == (long)(int)(uint)CONCAT11(uVar1,uVar2) + 3 + sVar5)) {
          n = sVar4 + 3;
          while (n < ssl->in_hslen) {
            if (ssl->in_hslen < n + 3) {
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                         ,0x1bc1,"bad certificate message");
              mbedtls_ssl_send_alert_message(ssl,'\x02','2');
              return -0x7300;
            }
            if (ssl->in_msg[n] != '\0') {
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                         ,0x1bca,"bad certificate message");
              mbedtls_ssl_send_alert_message(ssl,'\x02','+');
              return -0x7a00;
            }
            uVar6 = (ulong)CONCAT11(ssl->in_msg[n + 1],ssl->in_msg[n + 2]);
            lVar7 = n + 3;
            if ((uVar6 < 0x80) || (ssl->in_hslen < lVar7 + uVar6)) {
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                         ,0x1bd7,"bad certificate message");
              mbedtls_ssl_send_alert_message(ssl,'\x02','2');
              return -0x7300;
            }
            ret_00 = mbedtls_x509_crt_parse_der(chain,ssl->in_msg + lVar7,uVar6);
            if (ret_00 == -0x2880) {
              local_39 = 'P';
              goto LAB_0034fdcd;
            }
            if (ret_00 != -0x262e) {
              if (ret_00 == -0x2580) {
                local_39 = '+';
LAB_0034fdcd:
                mbedtls_ssl_send_alert_message(ssl,'\x02',local_39);
                mbedtls_debug_print_ret
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                           ,0x1c12," mbedtls_x509_crt_parse_der",ret_00);
                return ret_00;
              }
              if (ret_00 != 0) {
                local_39 = '*';
                goto LAB_0034fdcd;
              }
            }
            n = uVar6 + lVar7;
          }
          mbedtls_debug_print_crt
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,0x1c19,"peer certificate",chain);
          ssl_local._4_4_ = 0;
        }
        else {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,0x1bb4,"bad certificate message");
          mbedtls_ssl_send_alert_message(ssl,'\x02','2');
          ssl_local._4_4_ = -0x7300;
        }
      }
    }
    else {
      mbedtls_ssl_send_alert_message(ssl,'\x02','\n');
      ssl_local._4_4_ = -0x7700;
    }
  }
  else {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1b98,"bad certificate message");
    mbedtls_ssl_send_alert_message(ssl,'\x02','\n');
    ssl_local._4_4_ = -0x7700;
  }
  return ssl_local._4_4_;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_parse_certificate_chain(mbedtls_ssl_context *ssl,
                                       mbedtls_x509_crt *chain)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
#if defined(MBEDTLS_SSL_RENEGOTIATION) && defined(MBEDTLS_SSL_CLI_C)
    int crt_cnt = 0;
#endif
    size_t i, n;
    uint8_t alert;

    if (ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("bad certificate message"));
        mbedtls_ssl_send_alert_message(ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                       MBEDTLS_SSL_ALERT_MSG_UNEXPECTED_MESSAGE);
        return MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE;
    }

    if (ssl->in_msg[0] != MBEDTLS_SSL_HS_CERTIFICATE) {
        mbedtls_ssl_send_alert_message(ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                       MBEDTLS_SSL_ALERT_MSG_UNEXPECTED_MESSAGE);
        return MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE;
    }

    if (ssl->in_hslen < mbedtls_ssl_hs_hdr_len(ssl) + 3 + 3) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("bad certificate message"));
        mbedtls_ssl_send_alert_message(ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                       MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR);
        return MBEDTLS_ERR_SSL_DECODE_ERROR;
    }

    i = mbedtls_ssl_hs_hdr_len(ssl);

    /*
     * Same message structure as in mbedtls_ssl_write_certificate()
     */
    n = (ssl->in_msg[i+1] << 8) | ssl->in_msg[i+2];

    if (ssl->in_msg[i] != 0 ||
        ssl->in_hslen != n + 3 + mbedtls_ssl_hs_hdr_len(ssl)) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("bad certificate message"));
        mbedtls_ssl_send_alert_message(ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                       MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR);
        return MBEDTLS_ERR_SSL_DECODE_ERROR;
    }

    /* Make &ssl->in_msg[i] point to the beginning of the CRT chain. */
    i += 3;

    /* Iterate through and parse the CRTs in the provided chain. */
    while (i < ssl->in_hslen) {
        /* Check that there's room for the next CRT's length fields. */
        if (i + 3 > ssl->in_hslen) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("bad certificate message"));
            mbedtls_ssl_send_alert_message(ssl,
                                           MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                           MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR);
            return MBEDTLS_ERR_SSL_DECODE_ERROR;
        }
        /* In theory, the CRT can be up to 2**24 Bytes, but we don't support
         * anything beyond 2**16 ~ 64K. */
        if (ssl->in_msg[i] != 0) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("bad certificate message"));
            mbedtls_ssl_send_alert_message(ssl,
                                           MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                           MBEDTLS_SSL_ALERT_MSG_UNSUPPORTED_CERT);
            return MBEDTLS_ERR_SSL_BAD_CERTIFICATE;
        }

        /* Read length of the next CRT in the chain. */
        n = ((unsigned int) ssl->in_msg[i + 1] << 8)
            | (unsigned int) ssl->in_msg[i + 2];
        i += 3;

        if (n < 128 || i + n > ssl->in_hslen) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("bad certificate message"));
            mbedtls_ssl_send_alert_message(ssl,
                                           MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                           MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR);
            return MBEDTLS_ERR_SSL_DECODE_ERROR;
        }

        /* Check if we're handling the first CRT in the chain. */
#if defined(MBEDTLS_SSL_RENEGOTIATION) && defined(MBEDTLS_SSL_CLI_C)
        if (crt_cnt++ == 0 &&
            ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT &&
            ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_IN_PROGRESS) {
            /* During client-side renegotiation, check that the server's
             * end-CRTs hasn't changed compared to the initial handshake,
             * mitigating the triple handshake attack. On success, reuse
             * the original end-CRT instead of parsing it again. */
            MBEDTLS_SSL_DEBUG_MSG(3, ("Check that peer CRT hasn't changed during renegotiation"));
            if (ssl_check_peer_crt_unchanged(ssl,
                                             &ssl->in_msg[i],
                                             n) != 0) {
                MBEDTLS_SSL_DEBUG_MSG(1, ("new server cert during renegotiation"));
                mbedtls_ssl_send_alert_message(ssl,
                                               MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                               MBEDTLS_SSL_ALERT_MSG_ACCESS_DENIED);
                return MBEDTLS_ERR_SSL_BAD_CERTIFICATE;
            }

            /* Now we can safely free the original chain. */
            ssl_clear_peer_cert(ssl->session);
        }
#endif /* MBEDTLS_SSL_RENEGOTIATION && MBEDTLS_SSL_CLI_C */

        /* Parse the next certificate in the chain. */
#if defined(MBEDTLS_SSL_KEEP_PEER_CERTIFICATE)
        ret = mbedtls_x509_crt_parse_der(chain, ssl->in_msg + i, n);
#else
        /* If we don't need to store the CRT chain permanently, parse
         * it in-place from the input buffer instead of making a copy. */
        ret = mbedtls_x509_crt_parse_der_nocopy(chain, ssl->in_msg + i, n);
#endif /* MBEDTLS_SSL_KEEP_PEER_CERTIFICATE */
        switch (ret) {
            case 0: /*ok*/
            case MBEDTLS_ERR_X509_UNKNOWN_SIG_ALG + MBEDTLS_ERR_OID_NOT_FOUND:
                /* Ignore certificate with an unknown algorithm: maybe a
                   prior certificate was already trusted. */
                break;

            case MBEDTLS_ERR_X509_ALLOC_FAILED:
                alert = MBEDTLS_SSL_ALERT_MSG_INTERNAL_ERROR;
                goto crt_parse_der_failed;

            case MBEDTLS_ERR_X509_UNKNOWN_VERSION:
                alert = MBEDTLS_SSL_ALERT_MSG_UNSUPPORTED_CERT;
                goto crt_parse_der_failed;

            default:
                alert = MBEDTLS_SSL_ALERT_MSG_BAD_CERT;
crt_parse_der_failed:
                mbedtls_ssl_send_alert_message(ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL, alert);
                MBEDTLS_SSL_DEBUG_RET(1, " mbedtls_x509_crt_parse_der", ret);
                return ret;
        }

        i += n;
    }

    MBEDTLS_SSL_DEBUG_CRT(3, "peer certificate", chain);
    return 0;
}